

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::GetResolvedFeatures<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,Generator *this,EnumDescriptor *descriptor)

{
  FileDescriptor *this_00;
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  FieldOptions_OptionRetention FVar5;
  Descriptor *pDVar6;
  pointer pDVar7;
  undefined4 extraout_var;
  Message *ptr;
  MessageLite *this_01;
  FeatureSet *this_02;
  pointer this_03;
  type pMVar8;
  reference ppFVar9;
  LogMessage *pLVar10;
  FieldOptions *this_04;
  EnumDescriptor *this_05;
  AlphaNum *in_R8;
  string_view sVar11;
  AlphaNum local_368;
  basic_string_view<char,_std::char_traits<char>_> local_338;
  string local_328;
  AlphaNum local_308;
  AlphaNum local_2d8;
  string_view local_2a8;
  string local_298;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)524292>
  local_278;
  string local_268;
  AlphaNum local_248;
  AlphaNum local_218;
  string_view local_1e8;
  AlphaNum local_1d8;
  string local_1a8;
  EnumValueDescriptor *local_188;
  EnumValueDescriptor *value;
  EnumDescriptor *enm;
  byte local_161;
  LogMessage local_160;
  Voidify local_149;
  string_view local_148;
  byte local_131;
  LogMessage local_130;
  Voidify local_119;
  FieldDescriptor *local_118;
  FieldDescriptor *field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  feature_args;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_90;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> features;
  __single_object message_factory;
  LogMessage local_68;
  Voidify local_51;
  string_view local_50;
  Descriptor *local_40;
  Descriptor *feature_set;
  allocator<char> local_21;
  EnumDescriptor *local_20;
  EnumDescriptor *descriptor_local;
  Generator *this_local;
  
  local_20 = descriptor;
  descriptor_local = (EnumDescriptor *)this;
  this_local = (Generator *)__return_storage_ptr__;
  bVar2 = GeneratingDescriptorProto(this);
  if (bVar2) {
    this_00 = this->file_;
    pDVar6 = FeatureSet::GetDescriptor();
    local_50 = Descriptor::name(pDVar6);
    local_40 = FileDescriptor::FindMessageTypeByName(this_00,local_50);
    if (local_40 == (Descriptor *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
                 ,0x1d0,"feature_set != nullptr");
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (pLVar10,(char (*) [44])"Malformed descriptor.proto doesn\'t contain ");
      pDVar6 = FeatureSet::GetDescriptor();
      sVar11 = Descriptor::full_name(pDVar6);
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar10,sVar11);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar10);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_68);
    }
    std::make_unique<google::protobuf::DynamicMessageFactory>();
    pDVar7 = std::
             unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
             ::operator->((unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                           *)&features);
    iVar3 = (*(pDVar7->super_MessageFactory)._vptr_MessageFactory[2])(pDVar7,local_40);
    ptr = Message::New((Message *)CONCAT44(extraout_var,iVar3));
    absl::lts_20250127::WrapUnique<google::protobuf::Message>((lts_20250127 *)&local_90,ptr);
    this_01 = &std::
               unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               ::operator->(&local_90)->super_MessageLite;
    this_02 = CodeGenerator::GetResolvedSourceFeatures<google::protobuf::EnumDescriptor>(local_20);
    MessageLite::SerializeAsString_abi_cxx11_
              ((string *)
               &feature_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(MessageLite *)this_02);
    sVar11 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)
                        &feature_args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    MessageLite::ParseFromString(this_01,sVar11);
    std::__cxx11::string::~string
              ((string *)
               &feature_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&reflection);
    this_03 = std::
              unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
              ::operator->(&local_90);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Message::GetReflection(this_03);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&__range3);
    ppFVar1 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pMVar8 = std::
             unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
             ::operator*(&local_90);
    Reflection::ListFields
              ((Reflection *)ppFVar1,pMVar8,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&__range3);
    __end3 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)&__range3);
    field = (FieldDescriptor *)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)&__range3);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                  *)&field);
      if (!bVar2) break;
      ppFVar9 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&__end3);
      local_118 = *ppFVar9;
      TVar4 = FieldDescriptor::type(local_118);
      if (TVar4 == TYPE_ENUM) {
        this_04 = FieldDescriptor::options(local_118);
        FVar5 = FieldOptions::retention(this_04);
        if (FVar5 != FieldOptions_OptionRetention_RETENTION_SOURCE) {
          this_05 = FieldDescriptor::enum_type(local_118);
          ppFVar1 = fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          value = (EnumValueDescriptor *)this_05;
          pMVar8 = std::
                   unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                   ::operator*(&local_90);
          iVar3 = Reflection::GetEnumValue((Reflection *)ppFVar1,pMVar8,local_118);
          local_188 = EnumDescriptor::FindValueByNumber(this_05,iVar3);
          sVar11 = FieldDescriptor::name(local_118);
          local_1e8 = sVar11;
          absl::lts_20250127::AlphaNum::AlphaNum(&local_1d8,sVar11);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_218,"=");
          absl::lts_20250127::str_format_internal::
          FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)524292>
          ::FormatSpecTemplate(&local_278,"%s.values_by_name[\"%s\"].number");
          ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                    (&local_298,this,(EnumDescriptor *)value);
          local_2a8 = EnumValueDescriptor::name(local_188);
          absl::lts_20250127::
          StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    (&local_268,&local_278,&local_298,&local_2a8);
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_248,&local_268);
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_1a8,(lts_20250127 *)&local_1d8,&local_218,&local_248,in_R8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &reflection,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_298);
        }
      }
      else {
        bVar2 = FieldDescriptor::is_extension(local_118);
        local_131 = 0;
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_130,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
                     ,0x1e3,"field->is_extension()");
          local_131 = 1;
          pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_130);
          pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              (pLVar10,(char (*) [44])"Unsupported non-enum global feature found: ")
          ;
          local_148 = FieldDescriptor::full_name(local_118);
          pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar10,local_148);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_119,pLVar10);
        }
        if ((local_131 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_130);
        }
        iVar3 = FieldDescriptor::number(local_118);
        local_161 = 0;
        if (iVar3 == 0x3eb) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_160,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
                     ,0x1e7,"field->number() != 1003");
          local_161 = 1;
          pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_160);
          pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              (pLVar10,(char (*) [44])"Unsupported python-specific feature found: ")
          ;
          _enm = FieldDescriptor::full_name(local_118);
          pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar10,_enm);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_149,pLVar10);
        }
        if ((local_161 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_160);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end3);
    }
    absl::lts_20250127::AlphaNum::AlphaNum(&local_2d8,"_ResolvedFeatures(");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_338,",");
    sVar11._M_str = (char *)in_R8;
    sVar11._M_len = (size_t)local_338._M_str;
    absl::lts_20250127::
    StrJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_328,(lts_20250127 *)&reflection,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_338._M_len,sVar11);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_308,&local_328);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_368,")");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_2d8,&local_308,&local_368,in_R8);
    std::__cxx11::string::~string((string *)&local_328);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)&__range3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&reflection);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr(&local_90);
    std::
    unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
    ::~unique_ptr((unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                   *)&features);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"None",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::GetResolvedFeatures(
    const DescriptorT& descriptor) const {
  if (!GeneratingDescriptorProto()) {
    // Everything but descriptor.proto can handle proper feature resolution.
    return "None";
  }

  // Load the resolved features from our pool.
  const Descriptor* feature_set =
      file_->FindMessageTypeByName(FeatureSet::GetDescriptor()->name());
  ABSL_CHECK(feature_set != nullptr)
      << "Malformed descriptor.proto doesn't contain "
      << FeatureSet::GetDescriptor()->full_name();
  auto message_factory = absl::make_unique<DynamicMessageFactory>();
  auto features =
      absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
  features->ParseFromString(
      GetResolvedSourceFeatures(descriptor).SerializeAsString());

  // Collect all of the resolved features.
  std::vector<std::string> feature_args;
  const Reflection* reflection = features->GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*features, &fields);
  for (const auto* field : fields) {
    // Assume these are all enums.  If we add non-enum global features or any
    // python-specific features, we will need to come back and improve this
    // logic.
    if (field->type() != FieldDescriptor::TYPE_ENUM) {
      ABSL_CHECK(field->is_extension())
          << "Unsupported non-enum global feature found: "
          << field->full_name();
      // Placeholder for python-specific features.
      ABSL_CHECK(field->number() != 1003)
          << "Unsupported python-specific feature found: "
          << field->full_name();
      // Skip any non-python language-specific features.
      continue;
    }
    if (field->options().retention() == FieldOptions::RETENTION_SOURCE) {
      // Skip any source-retention features.
      continue;
    }
    const EnumDescriptor* enm = field->enum_type();
    const EnumValueDescriptor* value =
        enm->FindValueByNumber(reflection->GetEnumValue(*features, field));

    feature_args.emplace_back(absl::StrCat(
        field->name(), "=",
        absl::StrFormat("%s.values_by_name[\"%s\"].number",
                        ModuleLevelDescriptorName(*enm), value->name())));
  }
  return absl::StrCat("_ResolvedFeatures(", absl::StrJoin(feature_args, ","),
                      ")");
}